

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv.h
# Opt level: O0

uint64_t deref64(void *ptr)

{
  void *ptr_local;
  
  return *ptr;
}

Assistant:

INLINE uint64_t deref64(const void *ptr)
{
#ifdef _ALIGN_MEM_ACCESS
    // 8-byte align check (rightmost 3 bits must be '000')
    // Not sure whether 8-byte integer should be aligned in
    // 8-byte boundary or just 4-byte boundary.
    if ( (size_t)ptr & 0x7 ) {
        uint64_t value;
        memcpy(&value, ptr, sizeof(uint64_t));
        return value;
    }
#endif
    return *(uint64_t*)ptr;
}